

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  long *plVar1;
  size_type *psVar2;
  size_t sVar3;
  IStreamingReporter *pIVar4;
  size_t sVar5;
  size_t sVar6;
  int iVar7;
  SectionTracker *pSVar8;
  undefined4 extraout_var;
  IMutableContext *pIVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  size_t sVar13;
  string redirectedCerr;
  string redirectedCout;
  TestCaseInfo testInfo;
  string local_2f8;
  string local_2d8;
  size_t local_2b8;
  size_t sStack_2b0;
  TestCaseInfo local_2a0;
  TestCaseStats local_1a8;
  
  sVar3 = (this->m_totals).assertions.passed;
  sVar10 = (this->m_totals).assertions.failed;
  sVar11 = (this->m_totals).assertions.failedButOk;
  local_2b8 = (this->m_totals).testCases.passed;
  sStack_2b0 = (this->m_totals).testCases.failed;
  sVar13 = (this->m_totals).testCases.failedButOk;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_local_buf[0] = '\0';
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_local_buf[0] = '\0';
  TestCaseInfo::TestCaseInfo(&local_2a0,&testCase->super_TestCaseInfo);
  pIVar4 = (this->m_reporter).m_p;
  (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar4,&local_2a0);
  this->m_activeTestCase = testCase;
  psVar2 = &local_1a8.testInfo.name._M_string_length;
  do {
    pSVar8 = (SectionTracker *)TestCaseTracking::TrackerContext::startRun(&this->m_trackerContext);
    iVar7 = (*(pSVar8->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.
              super_IShared.super_NonCopyable._vptr_NonCopyable[0x10])(pSVar8);
    if ((char)iVar7 == '\0') {
      __assert_fail("rootTracker.isSectionTracker()",
                    "/workspace/llm4binary/github/license_c_cmakelists/effolkronium[P]random/test/catch.hpp"
                    ,0x19cb,"Totals Catch::RunContext::runTest(const TestCase &)");
    }
    iVar7 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[0x11])();
    TestCaseTracking::SectionTracker::addInitialFilters
              (pSVar8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(extraout_var,iVar7));
    do {
      (this->m_trackerContext).m_currentTracker = (this->m_trackerContext).m_rootTracker.m_p;
      (this->m_trackerContext).m_runState = Executing;
      local_1a8._vptr_TestCaseStats = (_func_int **)psVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,local_2a0.name._M_dataplus._M_p,
                 local_2a0.name._M_dataplus._M_p + local_2a0.name._M_string_length);
      local_1a8.testInfo.name.field_2._8_8_ = local_2a0.lineInfo.file;
      local_1a8.testInfo.className._M_dataplus._M_p = (pointer)local_2a0.lineInfo.line;
      pSVar8 = TestCaseTracking::SectionTracker::acquire
                         (&this->m_trackerContext,(NameAndLocation *)&local_1a8);
      this->m_testCaseTracker = (ITracker *)pSVar8;
      if (local_1a8._vptr_TestCaseStats != (_func_int **)psVar2) {
        operator_delete(local_1a8._vptr_TestCaseStats);
      }
      runCurrentTest(this,&local_2d8,&local_2f8);
      iVar7 = (*(this->m_testCaseTracker->super_SharedImpl<Catch::IShared>).super_IShared.
                super_NonCopyable._vptr_NonCopyable[6])();
      if ((char)iVar7 != '\0') break;
      iVar7 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xc])(this);
    } while ((char)iVar7 == '\0');
    pIVar9 = getCurrentMutableContext();
    iVar7 = (*(pIVar9->super_IContext)._vptr_IContext[5])(pIVar9);
    if ((char)iVar7 == '\0') break;
    iVar7 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xc])(this);
  } while ((char)iVar7 == '\0');
  sVar11 = (this->m_totals).assertions.failedButOk - sVar11;
  sVar10 = (this->m_totals).assertions.failed - sVar10;
  (__return_storage_ptr__->assertions).passed = (this->m_totals).assertions.passed - sVar3;
  (__return_storage_ptr__->assertions).failed = sVar10;
  (__return_storage_ptr__->assertions).failedButOk = sVar11;
  sVar3 = (this->m_totals).testCases.failedButOk;
  lVar12 = 0x20;
  if (sVar10 == 0) {
    lVar12 = (ulong)(sVar11 != 0) * 0x10 + 0x18;
  }
  sVar5 = (this->m_totals).testCases.passed;
  sVar6 = (this->m_totals).testCases.failed;
  (__return_storage_ptr__->testCases).passed = sVar5 - local_2b8;
  (__return_storage_ptr__->testCases).failed = sVar6 - sStack_2b0;
  (__return_storage_ptr__->testCases).failedButOk = sVar3 - sVar13;
  plVar1 = (long *)((long)&(__return_storage_ptr__->assertions).passed + lVar12);
  *plVar1 = *plVar1 + 1;
  sVar11 = (__return_storage_ptr__->testCases).passed;
  sVar13 = (__return_storage_ptr__->testCases).failed;
  if ((sVar11 != 0 & (byte)(undefined1)local_2a0.properties >> 2) == 1) {
    (__return_storage_ptr__->assertions).failed = sVar10 + 1;
    sVar11 = sVar11 - 1;
    (__return_storage_ptr__->testCases).passed = sVar11;
    sVar13 = sVar13 + 1;
    (__return_storage_ptr__->testCases).failed = sVar13;
  }
  (this->m_totals).testCases.passed = sVar5 + sVar11;
  (this->m_totals).testCases.failed = sVar6 + sVar13;
  (this->m_totals).testCases.failedButOk = sVar3 + (__return_storage_ptr__->testCases).failedButOk;
  pIVar4 = (this->m_reporter).m_p;
  iVar7 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xc])(this);
  TestCaseStats::TestCaseStats
            (&local_1a8,&local_2a0,__return_storage_ptr__,&local_2d8,&local_2f8,SUB41(iVar7,0));
  (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar4,&local_1a8);
  TestCaseStats::~TestCaseStats(&local_1a8);
  this->m_activeTestCase = (TestCase *)0x0;
  this->m_testCaseTracker = (ITracker *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.tagsAsString._M_dataplus._M_p != &local_2a0.tagsAsString.field_2) {
    operator_delete(local_2a0.tagsAsString._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_2a0.lcaseTags._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_2a0.tags._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.description._M_dataplus._M_p != &local_2a0.description.field_2) {
    operator_delete(local_2a0.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.className._M_dataplus._M_p != &local_2a0.className.field_2) {
    operator_delete(local_2a0.className._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
    operator_delete(local_2a0.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;

            do {
                ITracker& rootTracker = m_trackerContext.startRun();
                assert( rootTracker.isSectionTracker() );
                static_cast<SectionTracker&>( rootTracker ).addInitialFilters( m_config->getSectionsToRun() );
                do {
                    m_trackerContext.startCycle();
                    m_testCaseTracker = &SectionTracker::acquire( m_trackerContext, TestCaseTracking::NameAndLocation( testInfo.name, testInfo.lineInfo ) );
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isSuccessfullyCompleted() && !aborting() );
            }
            // !TBD: deprecated - this will be replaced by indexed trackers
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            if( testInfo.expectedToFail() && deltaTotals.testCases.passed > 0 ) {
                deltaTotals.assertions.failed++;
                deltaTotals.testCases.passed--;
                deltaTotals.testCases.failed++;
            }
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = CATCH_NULL;
            m_testCaseTracker = CATCH_NULL;

            return deltaTotals;
        }